

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

void enet_protocol_notify_connect(ENetHost *host,ENetPeer *peer,ENetEvent *event)

{
  ENetPeer *in_RDX;
  ENetHost *in_RSI;
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x20) = 1;
  if (in_RDX == (ENetPeer *)0x0) {
    enet_protocol_dispatch_state(in_RSI,(ENetPeer *)0x0,ENET_PEER_STATE_DISCONNECTED);
  }
  else {
    enet_protocol_change_state(in_RSI,in_RDX,ENET_PEER_STATE_DISCONNECTED);
    *(undefined4 *)&(in_RDX->dispatchList).next = 1;
    (in_RDX->dispatchList).previous = (_ENetListNode *)in_RSI;
    *(undefined4 *)((long)&in_RDX->host + 4) = *(undefined4 *)((long)in_RSI->commands + 0x15c);
  }
  return;
}

Assistant:

static void
enet_protocol_notify_connect (ENetHost * host, ENetPeer * peer, ENetEvent * event)
{
    host -> recalculateBandwidthLimits = 1;

    if (event != NULL)
    {
        enet_protocol_change_state (host, peer, ENET_PEER_STATE_CONNECTED);

        event -> type = ENET_EVENT_TYPE_CONNECT;
        event -> peer = peer;
        event -> data = peer -> eventData;
    }
    else 
        enet_protocol_dispatch_state (host, peer, peer -> state == ENET_PEER_STATE_CONNECTING ? ENET_PEER_STATE_CONNECTION_SUCCEEDED : ENET_PEER_STATE_CONNECTION_PENDING);
}